

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_common.c
# Opt level: O0

LY_ERR lysp_stmt_leaflist(lysp_ctx *ctx,lysp_stmt *stmt,lysp_node *parent,lysp_node **siblings)

{
  ly_stmt lVar1;
  lysp_node *plVar2;
  LY_ERR LVar3;
  lysp_node *plVar4;
  char *pcVar5;
  ly_ctx *local_d8;
  ly_ctx *local_c8;
  ly_ctx *local_c0;
  ly_ctx *local_b0;
  ly_ctx *local_a8;
  LY_ERR ret___15;
  LY_ERR ret___14;
  LY_ERR ret___13;
  LY_ERR ret___12;
  LY_ERR ret___11;
  LY_ERR ret___10;
  LY_ERR ret___9;
  LY_ERR ret___8;
  LY_ERR ret___7;
  LY_ERR ret___6;
  LY_ERR ret___5;
  LY_ERR ret___4;
  LY_ERR ret___3;
  LY_ERR ret___2;
  lysp_stmt *child;
  long *plStack_58;
  LY_ERR ret___1;
  char **iter__;
  size_t offset__;
  char *p__;
  LY_ERR ret__;
  lysp_node_leaflist *llist;
  lysp_node **siblings_local;
  lysp_node *parent_local;
  lysp_stmt *stmt_local;
  lysp_ctx *ctx_local;
  
  ctx_local._4_4_ = lysp_stmt_validate_value(ctx,Y_IDENTIF_ARG,stmt->arg);
  if (ctx_local._4_4_ == LY_SUCCESS) {
    plVar4 = (lysp_node *)calloc(1,0xd0);
    if (plVar4 == (lysp_node *)0x0) {
      if (ctx == (lysp_ctx *)0x0) {
        local_a8 = (ly_ctx *)0x0;
      }
      else {
        local_a8 = (ly_ctx *)
                   **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      }
      ly_log(local_a8,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lysp_stmt_leaflist");
      ctx_local._4_4_ = LY_EMEM;
    }
    else {
      if (*siblings == (lysp_node *)0x0) {
        *siblings = plVar4;
      }
      else {
        plVar2 = *siblings;
        while (plStack_58 = (long *)((long)plVar2 + (long)*siblings + (0x10 - (long)*siblings)),
              *plStack_58 != 0) {
          plVar2 = (lysp_node *)*plStack_58;
        }
        *plStack_58 = (long)plVar4;
      }
      plVar4->nodetype = 8;
      plVar4->parent = parent;
      if (ctx == (lysp_ctx *)0x0) {
        local_b0 = (ly_ctx *)0x0;
      }
      else {
        local_b0 = (ly_ctx *)
                   **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      }
      ctx_local._4_4_ = lydict_insert(local_b0,stmt->arg,0,&plVar4->name);
      if (ctx_local._4_4_ == LY_SUCCESS) {
        for (_ret___3 = stmt->child; _ret___3 != (lysp_stmt *)0x0; _ret___3 = _ret___3->next) {
          lVar1 = _ret___3->kw;
          if (lVar1 == LY_STMT_CONFIG) {
            LVar3 = lysp_stmt_config(ctx,_ret___3,&plVar4->flags,&plVar4->exts);
          }
          else if (lVar1 == LY_STMT_DEFAULT) {
            if (*(byte *)&(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1][2].schema
                < 2) {
              if (ctx == (lysp_ctx *)0x0) {
                local_c0 = (ly_ctx *)0x0;
              }
              else {
                local_c0 = (ly_ctx *)
                           **(undefined8 **)
                             (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
              }
              ly_vlog(local_c0,(char *)0x0,LYVE_SYNTAX_YANG,
                      "Invalid keyword \"%s\" as a child of \"%s\" - the statement is allowed only in YANG 1.1 modules."
                      ,"default","leaf-list");
              return LY_EVALID;
            }
            LVar3 = lysp_stmt_qnames(ctx,_ret___3,(lysp_qname **)(plVar4 + 3),Y_STR_ARG,
                                     &plVar4->exts);
          }
          else if (lVar1 == LY_STMT_DESCRIPTION) {
            LVar3 = lysp_stmt_text_field(ctx,_ret___3,0,&plVar4->dsc,Y_STR_ARG,&plVar4->exts);
          }
          else if (lVar1 == LY_STMT_EXTENSION_INSTANCE) {
            LVar3 = lysp_stmt_ext(ctx,_ret___3,LY_STMT_LEAF_LIST,0,&plVar4->exts);
          }
          else if (lVar1 == LY_STMT_IF_FEATURE) {
            LVar3 = lysp_stmt_qnames(ctx,_ret___3,&plVar4->iffeatures,Y_STR_ARG,&plVar4->exts);
          }
          else if (lVar1 == LY_STMT_MAX_ELEMENTS) {
            LVar3 = lysp_stmt_maxelements
                              (ctx,_ret___3,(uint32_t *)&plVar4[3].field_0xc,&plVar4->flags,
                               &plVar4->exts);
          }
          else if (lVar1 == LY_STMT_MIN_ELEMENTS) {
            LVar3 = lysp_stmt_minelements
                              (ctx,_ret___3,(uint32_t *)&plVar4[3].nodetype,&plVar4->flags,
                               &plVar4->exts);
          }
          else if (lVar1 == LY_STMT_MUST) {
            LVar3 = lysp_stmt_restrs(ctx,_ret___3,(lysp_restr **)(plVar4 + 1));
          }
          else if (lVar1 == LY_STMT_ORDERED_BY) {
            LVar3 = lysp_stmt_orderedby(ctx,_ret___3,&plVar4->flags,&plVar4->exts);
          }
          else if (lVar1 == LY_STMT_REFERENCE) {
            LVar3 = lysp_stmt_text_field(ctx,_ret___3,0,&plVar4->ref,Y_STR_ARG,&plVar4->exts);
          }
          else if (lVar1 == LY_STMT_STATUS) {
            LVar3 = lysp_stmt_status(ctx,_ret___3,&plVar4->flags,&plVar4->exts);
          }
          else if (lVar1 == LY_STMT_TYPE) {
            LVar3 = lysp_stmt_type(ctx,_ret___3,(lysp_type *)&plVar4[1].next);
          }
          else if (lVar1 == LY_STMT_UNITS) {
            LVar3 = lysp_stmt_text_field
                              (ctx,_ret___3,0,(char **)&plVar4[2].exts,Y_STR_ARG,&plVar4->exts);
          }
          else {
            if (lVar1 != LY_STMT_WHEN) {
              if (ctx == (lysp_ctx *)0x0) {
                local_c8 = (ly_ctx *)0x0;
              }
              else {
                local_c8 = (ly_ctx *)
                           **(undefined8 **)
                             (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
              }
              pcVar5 = lyplg_ext_stmt2str(_ret___3->kw);
              ly_vlog(local_c8,(char *)0x0,LYVE_SYNTAX_YANG,
                      "Invalid keyword \"%s\" as a child of \"%s\".",pcVar5,"llist");
              return LY_EVALID;
            }
            LVar3 = lysp_stmt_when(ctx,_ret___3,(lysp_when **)&plVar4[1].nodetype);
          }
          if (LVar3 != LY_SUCCESS) {
            return LVar3;
          }
        }
        if (plVar4[1].next == (lysp_node *)0x0) {
          if (ctx == (lysp_ctx *)0x0) {
            local_d8 = (ly_ctx *)0x0;
          }
          else {
            local_d8 = (ly_ctx *)
                       **(undefined8 **)
                         (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
          }
          ly_vlog(local_d8,(char *)0x0,LYVE_SYNTAX_YANG,
                  "Missing mandatory keyword \"%s\" as a child of \"%s\".","type","leaf-list");
          ctx_local._4_4_ = LY_EVALID;
        }
        else {
          ctx_local._4_4_ = LY_SUCCESS;
        }
      }
    }
  }
  return ctx_local._4_4_;
}

Assistant:

static LY_ERR
lysp_stmt_leaflist(struct lysp_ctx *ctx, const struct lysp_stmt *stmt, struct lysp_node *parent,
        struct lysp_node **siblings)
{
    struct lysp_node_leaflist *llist;

    LY_CHECK_RET(lysp_stmt_validate_value(ctx, Y_IDENTIF_ARG, stmt->arg));

    /* create new leaf-list structure */
    LY_LIST_NEW_RET(PARSER_CTX(ctx), siblings, llist, next, LY_EMEM);
    llist->nodetype = LYS_LEAFLIST;
    llist->parent = parent;

    /* get name */
    LY_CHECK_RET(lydict_insert(PARSER_CTX(ctx), stmt->arg, 0, &llist->name));

    /* parse substatements */
    for (const struct lysp_stmt *child = stmt->child; child; child = child->next) {
        switch (child->kw) {
        case LY_STMT_CONFIG:
            LY_CHECK_RET(lysp_stmt_config(ctx, child, &llist->flags, &llist->exts));
            break;
        case LY_STMT_DEFAULT:
            PARSER_CHECK_STMTVER2_RET(ctx, "default", "leaf-list");
            LY_CHECK_RET(lysp_stmt_qnames(ctx, child, &llist->dflts, Y_STR_ARG, &llist->exts));
            break;
        case LY_STMT_DESCRIPTION:
            LY_CHECK_RET(lysp_stmt_text_field(ctx, child, 0, &llist->dsc, Y_STR_ARG, &llist->exts));
            break;
        case LY_STMT_IF_FEATURE:
            LY_CHECK_RET(lysp_stmt_qnames(ctx, child, &llist->iffeatures, Y_STR_ARG, &llist->exts));
            break;
        case LY_STMT_MAX_ELEMENTS:
            LY_CHECK_RET(lysp_stmt_maxelements(ctx, child, &llist->max, &llist->flags, &llist->exts));
            break;
        case LY_STMT_MIN_ELEMENTS:
            LY_CHECK_RET(lysp_stmt_minelements(ctx, child, &llist->min, &llist->flags, &llist->exts));
            break;
        case LY_STMT_MUST:
            LY_CHECK_RET(lysp_stmt_restrs(ctx, child, &llist->musts));
            break;
        case LY_STMT_ORDERED_BY:
            LY_CHECK_RET(lysp_stmt_orderedby(ctx, child, &llist->flags, &llist->exts));
            break;
        case LY_STMT_REFERENCE:
            LY_CHECK_RET(lysp_stmt_text_field(ctx, child, 0, &llist->ref, Y_STR_ARG, &llist->exts));
            break;
        case LY_STMT_STATUS:
            LY_CHECK_RET(lysp_stmt_status(ctx, child, &llist->flags, &llist->exts));
            break;
        case LY_STMT_TYPE:
            LY_CHECK_RET(lysp_stmt_type(ctx, child, &llist->type));
            break;
        case LY_STMT_UNITS:
            LY_CHECK_RET(lysp_stmt_text_field(ctx, child, 0, &llist->units, Y_STR_ARG, &llist->exts));
            break;
        case LY_STMT_WHEN:
            LY_CHECK_RET(lysp_stmt_when(ctx, child, &llist->when));
            break;
        case LY_STMT_EXTENSION_INSTANCE:
            LY_CHECK_RET(lysp_stmt_ext(ctx, child, LY_STMT_LEAF_LIST, 0, &llist->exts));
            break;
        default:
            LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(child->kw), "llist");
            return LY_EVALID;
        }
    }

    /* mandatory substatements */
    if (!llist->type.name) {
        LOGVAL_PARSER(ctx, LY_VCODE_MISSTMT, "type", "leaf-list");
        return LY_EVALID;
    }

    return LY_SUCCESS;
}